

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# our_gl.cpp
# Opt level: O0

void triangle(Model *model,array<vec<4UL,_double>,_3UL> pts,IShader *shader,TGAImage *image,
             DepthBuffer *zbuffer)

{
  vec2f A;
  vec2f B;
  vec2f C;
  undefined1 auVar1 [8];
  double dVar2;
  double dVar3;
  uint uVar4;
  reference pvVar5;
  reference pvVar6;
  double *pdVar7;
  double *pdVar8;
  double dVar9;
  double dVar10;
  vec<2UL,_double> vVar11;
  vec2f P_00;
  double dStack_180;
  bool discard;
  double local_178;
  double local_170;
  double local_168;
  double frag_depth;
  double w;
  double z;
  vec<3UL,_double> local_148;
  undefined1 local_130 [8];
  vec3f bc_clip;
  undefined1 local_d0 [8];
  vec3f bc_screen;
  int iStack_b0;
  TGAColor color;
  vec2i P;
  double local_a0;
  int local_98;
  int local_94;
  int j;
  int i_1;
  vec2f bboxmax;
  vec2f bboxmin;
  double local_68;
  int local_5c;
  undefined1 local_58 [4];
  int i;
  array<vec<2UL,_double>,_3UL> pts2;
  DepthBuffer *zbuffer_local;
  TGAImage *image_local;
  IShader *shader_local;
  Model *model_local;
  
  pts2._M_elems[2].y = (double)zbuffer;
  std::array<vec<2UL,_double>,_3UL>::array((array<vec<2UL,_double>,_3UL> *)local_58);
  for (local_5c = 0; local_5c < 3; local_5c = local_5c + 1) {
    pvVar5 = std::array<vec<4UL,_double>,_3UL>::operator[](&pts,(long)local_5c);
    vVar11 = proj<2ul,4ul,double>(pvVar5);
    pvVar6 = std::array<vec<2UL,_double>,_3UL>::operator[]
                       ((array<vec<2UL,_double>,_3UL> *)local_58,(long)local_5c);
    bboxmin.y = vVar11.x;
    pvVar6->x = bboxmin.y;
    local_68 = vVar11.y;
    pvVar6->y = local_68;
  }
  dVar9 = std::numeric_limits<double>::max();
  dVar10 = std::numeric_limits<double>::max();
  vec<2UL,_double>::vec((vec<2UL,_double> *)&bboxmax.y,dVar9,dVar10);
  dVar9 = std::numeric_limits<double>::max();
  dVar10 = std::numeric_limits<double>::max();
  vec<2UL,_double>::vec((vec<2UL,_double> *)&j,-dVar9,-dVar10);
  for (local_94 = 0; local_94 < 3; local_94 = local_94 + 1) {
    for (local_98 = 0; local_98 < 2; local_98 = local_98 + 1) {
      pdVar7 = vec<2UL,_double>::operator[]((vec<2UL,_double> *)&bboxmax.y,(long)local_98);
      pvVar5 = std::array<vec<4UL,_double>,_3UL>::operator[](&pts,(long)local_94);
      pdVar8 = vec<4UL,_double>::operator[](pvVar5,(long)local_98);
      dVar9 = *pdVar8;
      pvVar5 = std::array<vec<4UL,_double>,_3UL>::operator[](&pts,(long)local_94);
      pdVar8 = vec<4UL,_double>::operator[](pvVar5,3);
      local_a0 = dVar9 / *pdVar8;
      pdVar7 = std::min<double>(pdVar7,&local_a0);
      dVar9 = *pdVar7;
      pdVar7 = vec<2UL,_double>::operator[]((vec<2UL,_double> *)&bboxmax.y,(long)local_98);
      *pdVar7 = dVar9;
      pdVar7 = vec<2UL,_double>::operator[]((vec<2UL,_double> *)&j,(long)local_98);
      pvVar5 = std::array<vec<4UL,_double>,_3UL>::operator[](&pts,(long)local_94);
      pdVar8 = vec<4UL,_double>::operator[](pvVar5,(long)local_98);
      dVar9 = *pdVar8;
      pvVar5 = std::array<vec<4UL,_double>,_3UL>::operator[](&pts,(long)local_94);
      pdVar8 = vec<4UL,_double>::operator[](pvVar5,3);
      P = (vec2i)(dVar9 / *pdVar8);
      pdVar7 = std::max<double>(pdVar7,(double *)&P);
      dVar9 = *pdVar7;
      pdVar7 = vec<2UL,_double>::operator[]((vec<2UL,_double> *)&j,(long)local_98);
      *pdVar7 = dVar9;
    }
  }
  vec<2UL,_int>::vec((vec<2UL,_int> *)&stack0xffffffffffffff50);
  TGAColor::TGAColor((TGAColor *)((long)&bc_screen.z + 3));
  for (iStack_b0 = (int)bboxmax.y; iStack_b0 <= (int)_j; iStack_b0 = iStack_b0 + 1) {
    for (color._1_4_ = (BADTYPE)bboxmin.x; (int)color._1_4_ <= (int)bboxmax.x;
        color._1_4_ = color._1_4_ + 1) {
      pvVar6 = std::array<vec<2UL,_double>,_3UL>::operator[]
                         ((array<vec<2UL,_double>,_3UL> *)local_58,0);
      A.x = pvVar6->x;
      A.y = pvVar6->y;
      pvVar6 = std::array<vec<2UL,_double>,_3UL>::operator[]
                         ((array<vec<2UL,_double>,_3UL> *)local_58,1);
      B.x = pvVar6->x;
      B.y = pvVar6->y;
      pvVar6 = std::array<vec<2UL,_double>,_3UL>::operator[]
                         ((array<vec<2UL,_double>,_3UL> *)local_58,2);
      C.x = pvVar6->x;
      C.y = pvVar6->y;
      bc_clip.z._4_1_ = color.bgra[1];
      bc_clip.z._5_1_ = color.bgra[2];
      bc_clip.z._6_1_ = color.bgra[3];
      bc_clip.z._7_1_ = color.bytespp;
      bc_clip.z._0_4_ = iStack_b0;
      P_00 = to_f((vec2i)bc_clip.z);
      barycentric((vec3f *)local_d0,A,B,C,P_00);
      auVar1 = local_d0;
      pvVar5 = std::array<vec<4UL,_double>,_3UL>::operator[](&pts,0);
      pdVar7 = vec<4UL,_double>::operator[](pvVar5,3);
      dVar2 = bc_screen.x;
      dVar9 = *pdVar7;
      pvVar5 = std::array<vec<4UL,_double>,_3UL>::operator[](&pts,1);
      pdVar7 = vec<4UL,_double>::operator[](pvVar5,3);
      dVar3 = bc_screen.y;
      dVar10 = *pdVar7;
      pvVar5 = std::array<vec<4UL,_double>,_3UL>::operator[](&pts,2);
      pdVar7 = vec<4UL,_double>::operator[](pvVar5,3);
      vec<3UL,_double>::vec
                ((vec<3UL,_double> *)local_130,(double)auVar1 / dVar9,dVar2 / dVar10,dVar3 / *pdVar7
                );
      z = (double)local_130 + bc_clip.x + bc_clip.y;
      operator/(&local_148,(vec<3UL,_double> *)local_130,&z);
      local_130 = (undefined1  [8])local_148.x;
      bc_clip.x = local_148.y;
      bc_clip.y = local_148.z;
      pvVar5 = std::array<vec<4UL,_double>,_3UL>::operator[](&pts,0);
      pdVar7 = vec<4UL,_double>::operator[](pvVar5,2);
      auVar1 = local_d0;
      dVar9 = *pdVar7;
      pvVar5 = std::array<vec<4UL,_double>,_3UL>::operator[](&pts,1);
      pdVar7 = vec<4UL,_double>::operator[](pvVar5,2);
      dVar10 = *pdVar7 * bc_screen.x;
      pvVar5 = std::array<vec<4UL,_double>,_3UL>::operator[](&pts,2);
      pdVar7 = vec<4UL,_double>::operator[](pvVar5,2);
      w = *pdVar7 * bc_screen.y + dVar9 * (double)auVar1 + dVar10;
      pvVar5 = std::array<vec<4UL,_double>,_3UL>::operator[](&pts,0);
      pdVar7 = vec<4UL,_double>::operator[](pvVar5,3);
      auVar1 = local_d0;
      dVar9 = *pdVar7;
      pvVar5 = std::array<vec<4UL,_double>,_3UL>::operator[](&pts,1);
      pdVar7 = vec<4UL,_double>::operator[](pvVar5,3);
      dVar10 = *pdVar7 * bc_screen.x;
      pvVar5 = std::array<vec<4UL,_double>,_3UL>::operator[](&pts,2);
      pdVar7 = vec<4UL,_double>::operator[](pvVar5,3);
      frag_depth = *pdVar7 * bc_screen.y + dVar9 * (double)auVar1 + dVar10;
      local_170 = 0.0;
      local_178 = 255.0;
      dStack_180 = w / frag_depth + 0.5;
      pdVar7 = std::min<double>(&local_178,&stack0xfffffffffffffe80);
      pdVar7 = std::max<double>(&local_170,pdVar7);
      local_168 = *pdVar7;
      if ((((0.0 <= (double)local_d0) && (0.0 <= bc_screen.x)) && (0.0 <= bc_screen.y)) &&
         ((dVar9 = DepthBuffer::get((DepthBuffer *)pts2._M_elems[2].y,(long)iStack_b0,
                                    (long)(int)color._1_4_), dVar9 <= local_168 &&
          (uVar4 = (*shader->_vptr_IShader[3])(shader,model,(undefined1 *)((long)&bc_screen.z + 3)),
          (uVar4 & 1) == 0)))) {
        DepthBuffer::set((DepthBuffer *)pts2._M_elems[2].y,(long)iStack_b0,(long)(int)color._1_4_,
                         local_168);
        TGAImage::set(image,(long)iStack_b0,(long)(int)color._1_4_,
                      (TGAColor *)((long)&bc_screen.z + 3));
      }
    }
  }
  return;
}

Assistant:

void triangle(Model &model, std::array<vec4f, 3> pts, IShader &shader, TGAImage &image,
              DepthBuffer &zbuffer)
{
    std::array<vec2f, 3> pts2;
    for (int i = 0; i < 3; i++) pts2[i] = proj<2>(pts[i]);

    vec2f bboxmin(std::numeric_limits<double>::max(), std::numeric_limits<double>::max());
    vec2f bboxmax(-std::numeric_limits<double>::max(), -std::numeric_limits<double>::max());
    for (int i = 0; i < 3; i++) {
        for (int j = 0; j < 2; j++) {
            bboxmin[j] = std::min(bboxmin[j], pts[i][j] / pts[i][3]);
            bboxmax[j] = std::max(bboxmax[j], pts[i][j] / pts[i][3]);
        }
    }
    vec2i P;
    TGAColor color;
    for (P.x = static_cast<int>(bboxmin.x); P.x <= static_cast<int>(bboxmax.x); P.x++) {
        for (P.y = static_cast<int>(bboxmin.y); P.y <= static_cast<int>(bboxmax.y); P.y++) {
            vec3f bc_screen = barycentric(pts2[0], pts2[1], pts2[2], to_f(P));
            vec3f bc_clip =
                vec3f(bc_screen.x / pts[0][3], bc_screen.y / pts[1][3], bc_screen.z / pts[2][3]);
            bc_clip = bc_clip / (bc_clip.x + bc_clip.y + bc_clip.z);
            double z = pts[0][2] * bc_screen.x + pts[1][2] * bc_screen.y + pts[2][2] * bc_screen.z;
            double w = pts[0][3] * bc_screen.x + pts[1][3] * bc_screen.y + pts[2][3] * bc_screen.z;
            double frag_depth = std::max(0., std::min(255., z / w + .5));
            if (bc_screen.x < 0 || bc_screen.y < 0 || bc_screen.z < 0 ||
                zbuffer.get(P.x, P.y) > frag_depth)
                continue;
            bool discard = shader.fragment(model, bc_clip, color);
            if (!discard) {
                zbuffer.set(P.x, P.y, frag_depth);
                image.set(P.x, P.y, color);
            }
        }
    }
}